

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O3

void MultiplicativeExpression_mod_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  JsValue *res_00;
  JsValue *v;
  JsValue *res_01;
  JsValue *in_RCX;
  undefined1 local_98 [8];
  JsValue r1;
  JsValue r2;
  JsValue r3;
  JsValue r4;
  
  (*JsNodeClassEval[(*(JsAstNode **)(na + 1))->astClass])
            (*(JsAstNode **)(na + 1),context,(JsValue *)local_98);
  res_00 = (JsValue *)((long)&r1.u + 8);
  JsGetValue((JsValue *)local_98,res_00);
  v = (JsValue *)((long)&r2.u + 8);
  (*JsNodeClassEval[((JsAstNode *)na[1].location)->astClass])((JsAstNode *)na[1].location,context,v)
  ;
  res_01 = (JsValue *)((long)&r3.u + 8);
  JsGetValue(v,res_01);
  MultiplicativeExpression_mod_common(res_00,res_01,(JsContext *)res,in_RCX);
  return;
}

Assistant:

static void
MultiplicativeExpression_mod_eval(na, context, res)
	struct JsAstNode *na; /* (struct JsAstBinaryNode) */
	struct JsContext *context;
	struct JsValue *res;
{
	struct JsAstBinaryNode *n = CAST_NODE(na, JsAstBinaryNode);
	struct JsValue r1, r2, r3, r4;

	EVAL(n->a, context, &r1);
	JsGetValue( &r1, &r2);
	EVAL(n->b, context, &r3);
	JsGetValue( &r3, &r4);
	MultiplicativeExpression_mod_common(&r2, &r4, context, res);
}